

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<std::array<tinyusdz::value::half,3ul>,float>
               (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *src,vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     *dst,vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               float eps)

{
  uint uVar1;
  undefined4 uVar2;
  pointer puVar3;
  _Hash_node_base *p_Var4;
  pointer paVar5;
  bool bVar6;
  pointer puVar7;
  mapped_type *pmVar8;
  __node_base _Var9;
  __hash_code __code;
  ulong uVar10;
  uint uVar11;
  size_type __new_size;
  uint32_t vidx;
  unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_3UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>_>
  vdata;
  uint local_78;
  float local_74;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              *)0x0) {
    bVar6 = false;
  }
  else {
    puVar7 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar10 = (long)puVar3 - (long)puVar7 >> 2;
    bVar6 = false;
    if ((((long)(src->
                super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(src->
                super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 1) * -0x5555555555555555 - uVar10 == 0
        ) && (2 < uVar10)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_74 = eps;
      if (puVar3 == puVar7) {
        __new_size = 1;
      }
      else {
        uVar10 = 0;
        uVar11 = 0;
        local_70 = dst;
        do {
          local_78 = puVar7[uVar10];
          if (uVar11 < local_78) {
            uVar11 = local_78;
          }
          if (local_68._M_buckets[(ulong)local_78 % local_68._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var4 = local_68._M_buckets[(ulong)local_78 % local_68._M_bucket_count]->_M_nxt;
            uVar1 = *(uint *)&p_Var4[1]._M_nxt;
            do {
              if (local_78 == uVar1) {
                pmVar8 = ::std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_78);
                bVar6 = math::is_close(pmVar8,(src->
                                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar10,
                                       local_74);
                if (bVar6) goto LAB_00377dc2;
                bVar6 = false;
                goto LAB_00377e39;
              }
              p_Var4 = p_Var4->_M_nxt;
            } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                    (uVar1 = *(uint *)&p_Var4[1]._M_nxt,
                    (ulong)uVar1 % local_68._M_bucket_count ==
                    (ulong)local_78 % local_68._M_bucket_count));
          }
          paVar5 = (src->
                   super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pmVar8 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,&local_78);
          *(undefined4 *)pmVar8->_M_elems = *(undefined4 *)paVar5[uVar10]._M_elems;
          pmVar8->_M_elems[2].value = paVar5[uVar10]._M_elems[2].value;
LAB_00377dc2:
          uVar10 = uVar10 + 1;
          puVar7 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)(faceVertexIndices->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7
                                 >> 2));
        __new_size = (size_type)(uVar11 + 1);
        dst = local_70;
      }
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::resize(dst,__new_size);
      memset((dst->
             super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start,0,__new_size * 6);
      bVar6 = true;
      for (_Var9._M_nxt = local_68._M_before_begin._M_nxt; _Var9._M_nxt != (_Hash_node_base *)0x0;
          _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
        uVar11 = *(uint *)&_Var9._M_nxt[1]._M_nxt;
        uVar2 = *(undefined4 *)((long)&_Var9._M_nxt[1]._M_nxt + 4);
        paVar5 = (dst->
                 super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        paVar5[uVar11]._M_elems[2].value = *(uint16_t *)&_Var9._M_nxt[2]._M_nxt;
        *(undefined4 *)paVar5[uVar11]._M_elems = uVar2;
      }
LAB_00377e39:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar6;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}